

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteSubProjects
          (cmGlobalGhsMultiGenerator *this,ostream *fout,string *all_target)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  undefined4 extraout_var;
  pointer ppcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar5 = std::operator<<(fout,"CMakeFiles/");
  poVar5 = std::operator<<(poVar5,(string *)all_target);
  poVar5 = std::operator<<(poVar5," [Project]");
  std::endl<char,std::char_traits<char>>(poVar5);
  ppcVar7 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppcVar1 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar7 == ppcVar1) {
      return;
    }
    this_00 = *ppcVar7;
    TVar3 = cmGeneratorTarget::GetType(this_00);
    if (TVar3 != INTERFACE_LIBRARY) {
      TVar3 = cmGeneratorTarget::GetType(this_00);
      if (TVar3 != MODULE_LIBRARY) {
        TVar3 = cmGeneratorTarget::GetType(this_00);
        if (TVar3 != SHARED_LIBRARY) {
          TVar3 = cmGeneratorTarget::GetType(this_00);
          if (TVar3 == GLOBAL_TARGET) {
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])(this);
            bVar2 = std::operator!=(psVar6,(char *)CONCAT44(extraout_var,iVar4));
            if (bVar2) goto LAB_00211461;
          }
          poVar5 = std::operator<<(fout,"CMakeFiles/");
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          std::operator+(&local_70,psVar6,".tgt");
          std::operator+(&local_50,&local_70,FILE_EXTENSION);
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          poVar5 = std::operator<<(poVar5," [Project]");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
LAB_00211461:
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteSubProjects(std::ostream& fout,
                                                 std::string& all_target)
{
  fout << "CMakeFiles/" << all_target << " [Project]" << std::endl;
  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }
    fout << "CMakeFiles/" << target->GetName() + ".tgt" + FILE_EXTENSION
         << " [Project]" << std::endl;
  }
}